

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O1

uint32_t __thiscall
event_track::DASHEventMessageBoxv1::parse
          (DASHEventMessageBoxv1 *this,char *ptr,uint data_size,uint64_t presentation_time)

{
  size_type sVar1;
  uint uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  ulong uVar5;
  long lVar6;
  allocator<char> local_51;
  string local_50;
  undefined7 uStack_4f;
  long local_40 [2];
  
  uVar3 = 0;
  if (8 < data_size) {
    if (ptr[8] == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"emsg v1",7);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
      std::ostream::put(-0x10);
      std::ostream::flush();
      fmp4_stream::full_box::parse(&this->super_full_box,ptr);
      uVar4 = fmp4_stream::box::size((box *)this);
      uVar2 = *(uint *)(ptr + uVar4 + 4);
      *(uint *)&(this->super_full_box).field_0x6c =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar5 = *(ulong *)(ptr + uVar4 + 8);
      this->presentation_time_ =
           uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
           (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
           (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
      uVar2 = *(uint *)(ptr + uVar4 + 0x10);
      this->event_duration_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = *(uint *)(ptr + uVar4 + 0x14);
      this->id_ = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      std::__cxx11::string::string<std::allocator<char>>(&local_50,ptr + uVar4 + 0x18,&local_51);
      std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,&local_50);
      if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
        operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
      }
      sVar1 = (this->scheme_id_uri_)._M_string_length;
      std::__cxx11::string::string<std::allocator<char>>
                (&local_50,ptr + uVar4 + sVar1 + 0x19,&local_51);
      std::__cxx11::string::operator=((string *)&this->value_,&local_50);
      if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
        operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
      }
      uVar2 = (int)(this->value_)._M_string_length + (int)uVar4 + (int)sVar1 + 0x1a;
      if (uVar2 < (this->super_full_box).super_box.size_) {
        uVar5 = (ulong)uVar2;
        do {
          local_50 = *(string *)(ptr + uVar5);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->message_data_,(uchar *)&local_50);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (this->super_full_box).super_box.size_);
      }
    }
    else {
      fmp4_stream::full_box::parse(&this->super_full_box,ptr);
      uVar4 = fmp4_stream::box::size((box *)this);
      std::__cxx11::string::string<std::allocator<char>>(&local_50,ptr + uVar4 + 4,&local_51);
      std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,&local_50);
      if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
        operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
      }
      sVar1 = (this->scheme_id_uri_)._M_string_length;
      std::__cxx11::string::string<std::allocator<char>>
                (&local_50,ptr + uVar4 + sVar1 + 5,&local_51);
      std::__cxx11::string::operator=((string *)&this->value_,&local_50);
      if ((long *)CONCAT71(uStack_4f,local_50) != local_40) {
        operator_delete((long *)CONCAT71(uStack_4f,local_50),local_40[0] + 1);
      }
      lVar6 = uVar4 + sVar1 + 5 + (this->value_)._M_string_length;
      uVar2 = *(uint *)(ptr + lVar6 + 1);
      *(uint *)&(this->super_full_box).field_0x6c =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = *(uint *)(ptr + lVar6 + 5);
      this->presentation_time_ =
           (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) +
           presentation_time;
      uVar2 = *(uint *)(ptr + lVar6 + 9);
      this->event_duration_ =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = *(uint *)(ptr + lVar6 + 0xd);
      this->id_ = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      uVar2 = (int)lVar6 + 0x11;
      if (uVar2 < (this->super_full_box).super_box.size_) {
        uVar5 = (ulong)uVar2;
        do {
          local_50 = *(string *)(ptr + uVar5);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                    (&this->message_data_,(uchar *)&local_50);
          uVar5 = uVar5 + 1;
        } while (uVar5 < (this->super_full_box).super_box.size_);
      }
    }
    uVar3 = (this->super_full_box).super_box.size_;
  }
  return uVar3;
}

Assistant:

uint32_t parse(const char *ptr, unsigned int data_size, uint64_t presentation_time = 0)
		{
			
			if (data_size > 8)
			{
				if ((uint8_t)*(ptr + 8) == 0x01) {
					std::cout << "emsg v1" << std::endl;

					fmp4_stream::full_box::parse(ptr);
					uint64_t offset = full_box::size();

					timescale_ = fmp4_read_uint32(ptr + offset);
					//cout << "timescale: " << timescale << endl;
					offset += 4;
					presentation_time_ = fmp4_read_uint64(ptr + offset);
					//cout << "presentation time: " << presentation_time << endl;
					offset += 8;
					event_duration_ = fmp4_read_uint32(ptr + offset);
					//cout << "event duration: " << event_duration << endl;
					offset += 4;
					id_ = fmp4_read_uint32(ptr + offset);
					offset += 4;
					//cout << "id: " << id << endl;
					scheme_id_uri_ = std::string(ptr + offset);
					offset = offset + scheme_id_uri_.size() + 1;
					//cout << "scheme_id_uri: " << scheme_id_uri << endl;
					value_ = std::string(ptr + offset);
					//cout << "value: " << value << endl;
					offset = offset + value_.size() + 1;

					for (unsigned int i = (unsigned int)offset; i < size_; i++)
						message_data_.push_back(*(ptr + (size_t)i));
				}
				else 
				{
					fmp4_stream::full_box::parse(ptr);
					uint64_t offset = full_box::size();
                    
					scheme_id_uri_ = std::string(ptr + offset);
					offset = offset + scheme_id_uri_.size() + 1;
					value_ = std::string(ptr + offset);
					offset = offset + value_.size() + 1;
					timescale_ = fmp4_read_uint32(ptr + offset);
					//cout << "timescale: " << timescale << endl;
					offset += 4;
					presentation_time_ = fmp4_read_uint32(ptr + offset) + presentation_time;
					//cout << "presentation time: " << presentation_time << endl;
					offset += 4;
					event_duration_ = fmp4_read_uint32(ptr + offset);
					//cout << "event duration: " << event_duration << endl;
					offset += 4;
					id_ = fmp4_read_uint32(ptr + offset);
					offset += 4;
					//cout << "id: " << id << endl;

					for (unsigned int i = (unsigned int)offset; i < size_; i++)
						message_data_.push_back(*(ptr + (size_t)i));
				}
				return size_;
			}
			return 0;
		}